

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O3

void __thiscall
flatbuffers::rust::RustGenerator::GenStruct(RustGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  const_iterator cVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  char *__s;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  key_type local_c20;
  string local_c00;
  StructDef *local_be0;
  IdlNamer *local_bd8;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  _Any_data local_170;
  code *local_160;
  code *local_158;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  string local_90;
  string local_70;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  paVar8 = &local_c20.field_2;
  if ((((this->super_BaseGenerator).parser_)->opts).no_leak_private_annotations == true) {
    local_c20._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c20,"private","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)&(struct_def->super_Definition).attributes,&local_c20);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &(struct_def->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
      __s = "pub";
    }
    else {
      __s = "pub(crate)";
      if (*(long *)(cVar4._M_node + 2) == 0) {
        __s = "pub";
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c20._M_dataplus._M_p != paVar8) {
      operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    __s = "pub";
  }
  local_c20._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c20,"ACCESS_TYPE","");
  paVar1 = &local_c00.field_2;
  local_c00._M_dataplus._M_p = (pointer)paVar1;
  sVar5 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c00,__s,__s + sVar5);
  this_00 = &this->code_;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_c20);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c00._M_dataplus._M_p != paVar1) {
    operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_dataplus._M_p != paVar8) {
    operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
  }
  GenComment(this,&(struct_def->super_Definition).doc_comment,"");
  local_c20._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c20,"ALIGN","");
  NumToString<unsigned_long>(&local_c00,struct_def->minalign);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_c20);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c00._M_dataplus._M_p != paVar1) {
    operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_dataplus._M_p != paVar8) {
    operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
  }
  local_c20._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c20,"STRUCT_TY","");
  local_bd8 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_c00,local_bd8,struct_def);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_c20);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c00._M_dataplus._M_p != paVar1) {
    operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_dataplus._M_p != paVar8) {
    operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
  }
  local_c20._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c20,"STRUCT_SIZE","");
  NumToString<unsigned_long>(&local_c00,struct_def->bytesize);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_c20);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c00._M_dataplus._M_p != paVar1) {
    operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_dataplus._M_p != paVar8) {
    operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"// struct {{STRUCT_TY}}, aligned to {{ALIGN}}","");
  CodeWriter::operator+=(this_00,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"#[repr(transparent)]","");
  CodeWriter::operator+=(this_00,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,"#[derive(Clone, Copy, PartialEq)]","");
  CodeWriter::operator+=(this_00,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"{{ACCESS_TYPE}} struct {{STRUCT_TY}}(pub [u8; {{STRUCT_SIZE}}]);"
             ,"");
  CodeWriter::operator+=(this_00,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"impl Default for {{STRUCT_TY}} { ","");
  CodeWriter::operator+=(this_00,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"  fn default() -> Self { ","");
  CodeWriter::operator+=(this_00,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,"    Self([0; {{STRUCT_SIZE}}])","");
  CodeWriter::operator+=(this_00,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"  }","");
  CodeWriter::operator+=(this_00,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"}","");
  CodeWriter::operator+=(this_00,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,"impl core::fmt::Debug for {{STRUCT_TY}} {","");
  CodeWriter::operator+=(this_00,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,
             "  fn fmt(&self, f: &mut core::fmt::Formatter) -> core::fmt::Result {","");
  CodeWriter::operator+=(this_00,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f0,"    f.debug_struct(\"{{STRUCT_TY}}\")","");
  CodeWriter::operator+=(this_00,&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2670:36)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2670:36)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"      .finish()","");
  CodeWriter::operator+=(this_00,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"  }","");
  CodeWriter::operator+=(this_00,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"}","");
  CodeWriter::operator+=(this_00,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"");
  CodeWriter::operator+=(this_00,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"impl flatbuffers::SimpleToVerifyInSlice for {{STRUCT_TY}} {}","")
  ;
  CodeWriter::operator+=(this_00,&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"impl<\'a> flatbuffers::Follow<\'a> for {{STRUCT_TY}} {","");
  CodeWriter::operator+=(this_00,&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d0,"  type Inner = &\'a {{STRUCT_TY}};","");
  CodeWriter::operator+=(this_00,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"  #[inline]","");
  CodeWriter::operator+=(this_00,&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_410,"  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {",
             "");
  CodeWriter::operator+=(this_00,&local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_430,"    <&\'a {{STRUCT_TY}}>::follow(buf, loc)","");
  CodeWriter::operator+=(this_00,&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"  }","");
  CodeWriter::operator+=(this_00,&local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"}","");
  CodeWriter::operator+=(this_00,&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_490,"impl<\'a> flatbuffers::Follow<\'a> for &\'a {{STRUCT_TY}} {","");
  CodeWriter::operator+=(this_00,&local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b0,"  type Inner = &\'a {{STRUCT_TY}};","");
  CodeWriter::operator+=(this_00,&local_4b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"  #[inline]","");
  CodeWriter::operator+=(this_00,&local_4d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f0,"  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {",
             "");
  CodeWriter::operator+=(this_00,&local_4f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_510,"    flatbuffers::follow_cast_ref::<{{STRUCT_TY}}>(buf, loc)","");
  CodeWriter::operator+=(this_00,&local_510);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"  }","");
  CodeWriter::operator+=(this_00,&local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"}","");
  CodeWriter::operator+=(this_00,&local_550);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_570,"impl<\'b> flatbuffers::Push for {{STRUCT_TY}} {","");
  CodeWriter::operator+=(this_00,&local_570);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_590,"    type Output = {{STRUCT_TY}};","");
  CodeWriter::operator+=(this_00,&local_590);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"    #[inline]","");
  CodeWriter::operator+=(this_00,&local_5b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d0,"    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {"
             ,"");
  CodeWriter::operator+=(this_00,&local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f0,
             "        let src = ::core::slice::from_raw_parts(self as *const {{STRUCT_TY}} as *const u8, Self::size());"
             ,"");
  CodeWriter::operator+=(this_00,&local_5f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_610,"        dst.copy_from_slice(src);","");
  CodeWriter::operator+=(this_00,&local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"    }","");
  CodeWriter::operator+=(this_00,&local_630);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"}","");
  CodeWriter::operator+=(this_00,&local_650);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"");
  CodeWriter::operator+=(this_00,&local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_690,"impl<\'a> flatbuffers::Verifiable for {{STRUCT_TY}} {","");
  CodeWriter::operator+=(this_00,&local_690);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"  #[inline]","");
  CodeWriter::operator+=(this_00,&local_6b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"  fn run_verifier(","");
  CodeWriter::operator+=(this_00,&local_6d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
  }
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f0,"    v: &mut flatbuffers::Verifier, pos: usize","");
  CodeWriter::operator+=(this_00,&local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_710,"  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {","");
  CodeWriter::operator+=(this_00,&local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_730,"    use self::flatbuffers::Verifiable;","");
  CodeWriter::operator+=(this_00,&local_730);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_750,"    v.in_buffer::<Self>(pos)","");
  CodeWriter::operator+=(this_00,&local_750);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"  }","");
  CodeWriter::operator+=(this_00,&local_770);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"}","");
  CodeWriter::operator+=(this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"");
  CodeWriter::operator+=(this_00,&local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).rust_serialize == true) {
    ppFVar2 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_c20._M_dataplus._M_p = (pointer)&local_c20.field_2;
    local_be0 = struct_def;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c20,"NUM_FIELDS","");
    NumToString<unsigned_long>(&local_c00,(long)ppFVar3 - (long)ppFVar2 >> 3);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_c20);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c00._M_dataplus._M_p != &local_c00.field_2) {
      operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
      operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
    }
    local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7d0,"impl Serialize for {{STRUCT_TY}} {","");
    CodeWriter::operator+=(this_00,&local_7d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
      operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
    }
    local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7f0,
               "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>","");
    CodeWriter::operator+=(this_00,&local_7f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
      operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
    }
    local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"  where","");
    CodeWriter::operator+=(this_00,&local_810);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_dataplus._M_p != &local_810.field_2) {
      operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
    }
    local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"    S: Serializer,","");
    CodeWriter::operator+=(this_00,&local_830);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_dataplus._M_p != &local_830.field_2) {
      operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
    }
    local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"  {","");
    CodeWriter::operator+=(this_00,&local_850);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_dataplus._M_p != &local_850.field_2) {
      operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
    }
    if (ppFVar3 == ppFVar2) {
      paVar8 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "    let s = serializer.serialize_struct(\"{{STRUCT_TY}}\", 0)?;","");
      CodeWriter::operator+=(this_00,&local_70);
      _Var7._M_p = local_70._M_dataplus._M_p;
    }
    else {
      paVar8 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "    let mut s = serializer.serialize_struct(\"{{STRUCT_TY}}\", {{NUM_FIELDS}})?;",
                 "");
      CodeWriter::operator+=(this_00,&local_90);
      _Var7._M_p = local_90._M_dataplus._M_p;
    }
    struct_def = local_be0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p != paVar8) {
      operator_delete(_Var7._M_p,paVar8->_M_allocated_capacity + 1);
    }
    local_b0._8_8_ = 0;
    local_98 = std::
               _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2740:38)>
               ::_M_invoke;
    local_a0 = std::
               _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2740:38)>
               ::_M_manager;
    local_b0._M_unused._M_object = this;
    ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_b0);
    if (local_a0 != (code *)0x0) {
      (*local_a0)(&local_b0,&local_b0,__destroy_functor);
    }
    local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"    s.end()","");
    CodeWriter::operator+=(this_00,&local_870);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_870._M_dataplus._M_p != &local_870.field_2) {
      operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
    }
    local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"  }","");
    CodeWriter::operator+=(this_00,&local_890);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890._M_dataplus._M_p != &local_890.field_2) {
      operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
    }
    local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"}","");
    CodeWriter::operator+=(this_00,&local_8b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
      operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
    }
    local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"");
    CodeWriter::operator+=(this_00,&local_8d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
      operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
    }
  }
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8f0,"impl<\'a> {{STRUCT_TY}} {","");
  CodeWriter::operator+=(this_00,&local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_910,"  #[allow(clippy::too_many_arguments)]","");
  CodeWriter::operator+=(this_00,&local_910);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"  pub fn new(","");
  CodeWriter::operator+=(this_00,&local_930);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
  }
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2756:36)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2756:36)>
             ::_M_manager;
  local_d0._M_unused._M_object = this;
  ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_d0);
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"  ) -> Self {","");
  CodeWriter::operator+=(this_00,&local_950);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
  }
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_970,"    let mut s = Self([0; {{STRUCT_SIZE}}]);","");
  CodeWriter::operator+=(this_00,&local_970);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
  }
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2762:36)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2762:36)>
             ::_M_manager;
  local_f0._M_unused._M_object = this;
  ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_f0);
  if (local_e0 != (code *)0x0) {
    (*local_e0)(&local_f0,&local_f0,__destroy_functor);
  }
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"    s","");
  CodeWriter::operator+=(this_00,&local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
  }
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,"  }","");
  CodeWriter::operator+=(this_00,&local_9b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
  }
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"");
  CodeWriter::operator+=(this_00,&local_9d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).generate_name_strings == true) {
    GenFullyQualifiedNameGetter(this,struct_def,(string *)struct_def);
  }
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2775:36)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2775:36)>
              ::_M_manager;
  local_110._M_unused._M_object = this;
  ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_110);
  if (local_100 != (code *)0x0) {
    (*local_100)(&local_110,&local_110,__destroy_functor);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
    local_c20._M_dataplus._M_p = (pointer)&local_c20.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c20,"STRUCT_OTY","");
    (*(local_bd8->super_Namer)._vptr_Namer[0x11])(&local_c00,local_bd8,struct_def);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_c20);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c00._M_dataplus._M_p != &local_c00.field_2) {
      operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
      operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
    }
    local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_9f0,"  pub fn unpack(&self) -> {{STRUCT_OTY}} {","");
    CodeWriter::operator+=(this_00,&local_9f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
      operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
    }
    local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"    {{STRUCT_OTY}} {","");
    CodeWriter::operator+=(this_00,&local_a10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
      operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
    }
    local_130._8_8_ = 0;
    local_118 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2886:38)>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2886:38)>
                ::_M_manager;
    local_130._M_unused._M_object = this;
    ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_130)
    ;
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"    }","");
    CodeWriter::operator+=(this_00,&local_a30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
      operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
    }
    local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a50,"  }","");
    CodeWriter::operator+=(this_00,&local_a50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
      operator_delete(local_a50._M_dataplus._M_p,local_a50.field_2._M_allocated_capacity + 1);
    }
  }
  local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"}","");
  CodeWriter::operator+=(this_00,&local_a70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
  }
  local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"");
  CodeWriter::operator+=(this_00,&local_a90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
    operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
    local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ab0,"#[derive(Debug, Clone, PartialEq, Default)]","");
    CodeWriter::operator+=(this_00,&local_ab0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
      operator_delete(local_ab0._M_dataplus._M_p,local_ab0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ad0,"{{ACCESS_TYPE}} struct {{STRUCT_OTY}} {","");
    CodeWriter::operator+=(this_00,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_150._8_8_ = 0;
    local_138 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2913:38)>
                ::_M_invoke;
    local_140 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2913:38)>
                ::_M_manager;
    local_150._M_unused._M_object = this;
    ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_150)
    ;
    if (local_140 != (code *)0x0) {
      (*local_140)(&local_150,&local_150,__destroy_functor);
    }
    local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"}","");
    CodeWriter::operator+=(this_00,&local_af0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
      operator_delete(local_af0._M_dataplus._M_p,local_af0.field_2._M_allocated_capacity + 1);
    }
    local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"impl {{STRUCT_OTY}} {","")
    ;
    CodeWriter::operator+=(this_00,&local_b10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
      operator_delete(local_b10._M_dataplus._M_p,local_b10.field_2._M_allocated_capacity + 1);
    }
    local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b30,"  pub fn pack(&self) -> {{STRUCT_TY}} {","");
    CodeWriter::operator+=(this_00,&local_b30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
      operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
    }
    local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b50,"    {{STRUCT_TY}}::new(","");
    CodeWriter::operator+=(this_00,&local_b50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
      operator_delete(local_b50._M_dataplus._M_p,local_b50.field_2._M_allocated_capacity + 1);
    }
    local_170._8_8_ = 0;
    local_158 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2923:38)>
                ::_M_invoke;
    local_160 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2923:38)>
                ::_M_manager;
    local_170._M_unused._M_object = this;
    ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_170)
    ;
    if (local_160 != (code *)0x0) {
      (*local_160)(&local_170,&local_170,__destroy_functor);
    }
    local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b70,"    )","");
    CodeWriter::operator+=(this_00,&local_b70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
      operator_delete(local_b70._M_dataplus._M_p,local_b70.field_2._M_allocated_capacity + 1);
    }
    local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b90,"  }","");
    CodeWriter::operator+=(this_00,&local_b90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
      operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
    }
    local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"}","");
    CodeWriter::operator+=(this_00,&local_bb0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
      operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
    }
    local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd0,"");
    CodeWriter::operator+=(this_00,&local_bd0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
      operator_delete(local_bd0._M_dataplus._M_p,local_bd0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def) {
    const bool is_private =
        parser_.opts.no_leak_private_annotations &&
        (struct_def.attributes.Lookup("private") != nullptr);
    code_.SetValue("ACCESS_TYPE", is_private ? "pub(crate)" : "pub");
    // Generates manual padding and alignment.
    // Variables are private because they contain little endian data on all
    // platforms.
    GenComment(struct_def.doc_comment);
    code_.SetValue("ALIGN", NumToString(struct_def.minalign));
    code_.SetValue("STRUCT_TY", namer_.Type(struct_def));
    code_.SetValue("STRUCT_SIZE", NumToString(struct_def.bytesize));

    // We represent Flatbuffers-structs in Rust-u8-arrays since the data may be
    // of the wrong endianness and alignment 1.
    //
    // PartialEq is useful to derive because we can correctly compare structs
    // for equality by just comparing their underlying byte data. This doesn't
    // hold for PartialOrd/Ord.
    code_ += "// struct {{STRUCT_TY}}, aligned to {{ALIGN}}";
    code_ += "#[repr(transparent)]";
    code_ += "#[derive(Clone, Copy, PartialEq)]";
    code_ += "{{ACCESS_TYPE}} struct {{STRUCT_TY}}(pub [u8; {{STRUCT_SIZE}}]);";
    code_ += "impl Default for {{STRUCT_TY}} { ";
    code_ += "  fn default() -> Self { ";
    code_ += "    Self([0; {{STRUCT_SIZE}}])";
    code_ += "  }";
    code_ += "}";

    // Debug for structs.
    code_ += "impl core::fmt::Debug for {{STRUCT_TY}} {";
    code_ +=
        "  fn fmt(&self, f: &mut core::fmt::Formatter"
        ") -> core::fmt::Result {";
    code_ += "    f.debug_struct(\"{{STRUCT_TY}}\")";
    ForAllStructFields(struct_def, [&](const FieldDef &unused) {
      (void)unused;
      code_ += "    .field(\"{{FIELD}}\", &self.{{FIELD}}())";
    });
    code_ += "      .finish()";
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Generate impls for SafeSliceAccess (because all structs are endian-safe),
    // Follow for the value type, Follow for the reference type, Push for the
    // value type, and Push for the reference type.
    code_ += "impl flatbuffers::SimpleToVerifyInSlice for {{STRUCT_TY}} {}";
    code_ += "impl<'a> flatbuffers::Follow<'a> for {{STRUCT_TY}} {";
    code_ += "  type Inner = &'a {{STRUCT_TY}};";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ += "    <&'a {{STRUCT_TY}}>::follow(buf, loc)";
    code_ += "  }";
    code_ += "}";
    code_ += "impl<'a> flatbuffers::Follow<'a> for &'a {{STRUCT_TY}} {";
    code_ += "  type Inner = &'a {{STRUCT_TY}};";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ += "    flatbuffers::follow_cast_ref::<{{STRUCT_TY}}>(buf, loc)";
    code_ += "  }";
    code_ += "}";
    code_ += "impl<'b> flatbuffers::Push for {{STRUCT_TY}} {";
    code_ += "    type Output = {{STRUCT_TY}};";
    code_ += "    #[inline]";
    code_ += "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {";
    code_ +=
        "        let src = ::core::slice::from_raw_parts(self as *const "
        "{{STRUCT_TY}} as *const u8, Self::size());";
    code_ += "        dst.copy_from_slice(src);";
    code_ += "    }";
    code_ += "}";
    code_ += "";

    // Generate verifier: Structs are simple so presence and alignment are
    // all that need to be checked.
    code_ += "impl<'a> flatbuffers::Verifiable for {{STRUCT_TY}} {";
    code_ += "  #[inline]";
    code_ += "  fn run_verifier(";
    code_ += "    v: &mut flatbuffers::Verifier, pos: usize";
    code_ += "  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {";
    code_ += "    use self::flatbuffers::Verifiable;";
    code_ += "    v.in_buffer::<Self>(pos)";
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Implement serde::Serialize
    if (parser_.opts.rust_serialize) {
      const auto numFields = struct_def.fields.vec.size();
      code_.SetValue("NUM_FIELDS", NumToString(numFields));
      code_ += "impl Serialize for {{STRUCT_TY}} {";
      code_ +=
          "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>";
      code_ += "  where";
      code_ += "    S: Serializer,";
      code_ += "  {";
      if (numFields == 0) {
        code_ +=
            "    let s = serializer.serialize_struct(\"{{STRUCT_TY}}\", 0)?;";
      } else {
        code_ +=
            "    let mut s = serializer.serialize_struct(\"{{STRUCT_TY}}\", "
            "{{NUM_FIELDS}})?;";
      }
      ForAllStructFields(struct_def, [&](const FieldDef &unused) {
        (void)unused;
        code_ +=
            "    s.serialize_field(\"{{FIELD}}\", "
            "&self.{{FIELD}}())?;";
      });
      code_ += "    s.end()";
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }

    // Generate a constructor that takes all fields as arguments.
    code_ += "impl<'a> {{STRUCT_TY}} {";
    code_ += "  #[allow(clippy::too_many_arguments)]";
    code_ += "  pub fn new(";
    ForAllStructFields(struct_def, [&](const FieldDef &unused) {
      (void)unused;
      code_ += "  {{FIELD}}: {{REF}}{{FIELD_TYPE}},";
    });
    code_ += "  ) -> Self {";
    code_ += "    let mut s = Self([0; {{STRUCT_SIZE}}]);";
    ForAllStructFields(struct_def, [&](const FieldDef &unused) {
      (void)unused;
      code_ += "  s.set_{{FIELD}}({{FIELD}});";
    });
    code_ += "    s";
    code_ += "  }";
    code_ += "";

    if (parser_.opts.generate_name_strings) {
      GenFullyQualifiedNameGetter(struct_def, struct_def.name);
    }

    // Generate accessor methods for the struct.
    ForAllStructFields(struct_def, [&](const FieldDef &field) {
      this->GenComment(field.doc_comment);
      // Getter.
      if (IsStruct(field.value.type)) {
        code_ += "pub fn {{FIELD}}(&self) -> &{{FIELD_TYPE}} {";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid struct in this slot";
        code_ +=
            "  unsafe {"
            " &*(self.0[{{FIELD_OFFSET}}..].as_ptr() as *const"
            " {{FIELD_TYPE}}) }";
      } else if (IsArray(field.value.type)) {
        code_.SetValue("ARRAY_SIZE",
                       NumToString(field.value.type.fixed_length));
        code_.SetValue("ARRAY_ITEM", GetTypeGet(field.value.type.VectorType()));
        code_ +=
            "pub fn {{FIELD}}(&'a self) -> "
            "flatbuffers::Array<'a, {{ARRAY_ITEM}}, {{ARRAY_SIZE}}> {";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid array in this slot";
        code_ +=
            "  unsafe { flatbuffers::Array::follow(&self.0, {{FIELD_OFFSET}}) "
            "}";
      } else {
        code_ += "pub fn {{FIELD}}(&self) -> {{FIELD_TYPE}} {";
        code_ +=
            "  let mut mem = core::mem::MaybeUninit::"
            "<<{{FIELD_TYPE}} as EndianScalar>::Scalar>::uninit();";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid value in this slot";
        code_ += "  EndianScalar::from_little_endian(unsafe {";
        code_ += "    core::ptr::copy_nonoverlapping(";
        code_ += "      self.0[{{FIELD_OFFSET}}..].as_ptr(),";
        code_ += "      mem.as_mut_ptr() as *mut u8,";
        code_ +=
            "      core::mem::size_of::<<{{FIELD_TYPE}} as "
            "EndianScalar>::Scalar>(),";
        code_ += "    );";
        code_ += "    mem.assume_init()";
        code_ += "  })";
      }
      code_ += "}\n";
      // Setter.
      if (IsStruct(field.value.type)) {
        code_.SetValue("FIELD_SIZE", NumToString(InlineSize(field.value.type)));
        code_ += "#[allow(clippy::identity_op)]";  // If FIELD_OFFSET=0.
        code_ += "pub fn set_{{FIELD}}(&mut self, x: &{{FIELD_TYPE}}) {";
        code_ +=
            "  self.0[{{FIELD_OFFSET}}..{{FIELD_OFFSET}} + {{FIELD_SIZE}}]"
            ".copy_from_slice(&x.0)";
      } else if (IsArray(field.value.type)) {
        if (GetFullType(field.value.type) == ftArrayOfBuiltin) {
          code_.SetValue("ARRAY_ITEM",
                         GetTypeGet(field.value.type.VectorType()));
          code_.SetValue(
              "ARRAY_ITEM_SIZE",
              NumToString(InlineSize(field.value.type.VectorType())));
          code_ +=
              "pub fn set_{{FIELD}}(&mut self, items: &{{FIELD_TYPE}}) "
              "{";
          code_ += "  // Safety:";
          code_ += "  // Created from a valid Table for this object";
          code_ += "  // Which contains a valid array in this slot";
          code_ +=
              "  unsafe { flatbuffers::emplace_scalar_array(&mut self.0, "
              "{{FIELD_OFFSET}}, items) };";
        } else {
          code_.SetValue("FIELD_SIZE",
                         NumToString(InlineSize(field.value.type)));
          code_ += "pub fn set_{{FIELD}}(&mut self, x: &{{FIELD_TYPE}}) {";
          code_ += "  // Safety:";
          code_ += "  // Created from a valid Table for this object";
          code_ += "  // Which contains a valid array in this slot";
          code_ += "  unsafe {";
          code_ += "    core::ptr::copy(";
          code_ += "      x.as_ptr() as *const u8,";
          code_ += "      self.0.as_mut_ptr().add({{FIELD_OFFSET}}),";
          code_ += "      {{FIELD_SIZE}},";
          code_ += "    );";
          code_ += "  }";
        }
      } else {
        code_ += "pub fn set_{{FIELD}}(&mut self, x: {{FIELD_TYPE}}) {";
        code_ += "  let x_le = x.to_little_endian();";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid value in this slot";
        code_ += "  unsafe {";
        code_ += "    core::ptr::copy_nonoverlapping(";
        code_ += "      &x_le as *const _ as *const u8,";
        code_ += "      self.0[{{FIELD_OFFSET}}..].as_mut_ptr(),";
        code_ +=
            "      core::mem::size_of::<<{{FIELD_TYPE}} as "
            "EndianScalar>::Scalar>(),";
        code_ += "    );";
        code_ += "  }";
      }
      code_ += "}\n";

      // Generate a comparison function for this field if it is a key.
      if (field.key) { GenKeyFieldMethods(field); }
    });

    // Generate Object API unpack method.
    if (parser_.opts.generate_object_based_api) {
      code_.SetValue("STRUCT_OTY", namer_.ObjectType(struct_def));
      code_ += "  pub fn unpack(&self) -> {{STRUCT_OTY}} {";
      code_ += "    {{STRUCT_OTY}} {";
      ForAllStructFields(struct_def, [&](const FieldDef &field) {
        if (IsArray(field.value.type)) {
          if (GetFullType(field.value.type) == ftArrayOfStruct) {
            code_ +=
                "    {{FIELD}}: { let {{FIELD}} = "
                "self.{{FIELD}}(); flatbuffers::array_init(|i| "
                "{{FIELD}}.get(i).unpack()) },";
          } else {
            code_ += "    {{FIELD}}: self.{{FIELD}}().into(),";
          }
        } else {
          std::string unpack = IsStruct(field.value.type) ? ".unpack()" : "";
          code_ += "    {{FIELD}}: self.{{FIELD}}()" + unpack + ",";
        }
      });
      code_ += "    }";
      code_ += "  }";
    }

    code_ += "}";  // End impl Struct methods.
    code_ += "";

    // Generate Struct Object.
    if (parser_.opts.generate_object_based_api) {
      // Struct declaration
      code_ += "#[derive(Debug, Clone, PartialEq, Default)]";
      code_ += "{{ACCESS_TYPE}} struct {{STRUCT_OTY}} {";
      ForAllStructFields(struct_def, [&](const FieldDef &field) {
        (void)field;  // unused.
        code_ += "pub {{FIELD}}: {{FIELD_OTY}},";
      });
      code_ += "}";
      // The `pack` method that turns the native struct into its Flatbuffers
      // counterpart.
      code_ += "impl {{STRUCT_OTY}} {";
      code_ += "  pub fn pack(&self) -> {{STRUCT_TY}} {";
      code_ += "    {{STRUCT_TY}}::new(";
      ForAllStructFields(struct_def, [&](const FieldDef &field) {
        if (IsStruct(field.value.type)) {
          code_ += "    &self.{{FIELD}}.pack(),";
        } else if (IsArray(field.value.type)) {
          if (GetFullType(field.value.type) == ftArrayOfStruct) {
            code_ +=
                "    &flatbuffers::array_init(|i| "
                "self.{{FIELD}}[i].pack()),";
          } else {
            code_ += "    &self.{{FIELD}},";
          }
        } else {
          code_ += "    self.{{FIELD}},";
        }
      });
      code_ += "    )";
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }
  }